

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void __thiscall slang::ast::LookupResult::clear(LookupResult *this)

{
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  bitmask<slang::ast::LookupResultFlags> in_stack_fffffffffffffff7;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  bitmask<slang::ast::LookupResultFlags>::bitmask
            ((bitmask<slang::ast::LookupResultFlags> *)&stack0xfffffffffffffff7,None);
  *(underlying_type *)((long)in_RDI + 0x14) = in_stack_fffffffffffffff7.m_bits;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  ::clear((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
           *)CONCAT17(in_stack_fffffffffffffff7.m_bits,in_stack_fffffffffffffff0));
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::clear
            ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
             CONCAT17(in_stack_fffffffffffffff7.m_bits,in_stack_fffffffffffffff0));
  SmallVectorBase<slang::Diagnostic>::clear
            ((SmallVectorBase<slang::Diagnostic> *)
             CONCAT17(in_stack_fffffffffffffff7.m_bits,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void LookupResult::clear() {
    found = nullptr;
    systemSubroutine = nullptr;
    upwardCount = 0;
    flags = LookupResultFlags::None;
    selectors.clear();
    path.clear();
    diagnostics.clear();
}